

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_xor.c
# Opt level: O1

void array_run_container_lazy_xor
               (array_container_t *src_1,run_container_t *src_2,run_container_t *dst)

{
  uint16_t start;
  int iVar1;
  long lVar2;
  int iVar3;
  
  iVar3 = 0;
  run_container_grow(dst,src_2->n_runs + src_1->cardinality,false);
  dst->n_runs = 0;
  iVar1 = 0;
  if (0 < src_2->n_runs) {
    iVar1 = 0;
    iVar3 = 0;
    do {
      if (src_1->cardinality <= iVar1) break;
      start = src_2->runs[iVar3].value;
      if (src_1->array[iVar1] < start) {
        run_container_smart_append_exclusive(dst,src_1->array[iVar1],0);
        iVar1 = iVar1 + 1;
      }
      else {
        run_container_smart_append_exclusive(dst,start,src_2->runs[iVar3].length);
        iVar3 = iVar3 + 1;
      }
    } while (iVar3 < src_2->n_runs);
  }
  if (iVar1 < src_1->cardinality) {
    lVar2 = (long)iVar1;
    do {
      run_container_smart_append_exclusive(dst,src_1->array[lVar2],0);
      lVar2 = lVar2 + 1;
    } while (lVar2 < src_1->cardinality);
  }
  if (iVar3 < src_2->n_runs) {
    lVar2 = (long)iVar3;
    do {
      run_container_smart_append_exclusive(dst,src_2->runs[lVar2].value,src_2->runs[lVar2].length);
      lVar2 = lVar2 + 1;
    } while (lVar2 < src_2->n_runs);
  }
  return;
}

Assistant:

void array_run_container_lazy_xor(const array_container_t *src_1,
                                  const run_container_t *src_2,
                                  run_container_t *dst) {
    run_container_grow(dst, src_1->cardinality + src_2->n_runs, false);
    int32_t rlepos = 0;
    int32_t arraypos = 0;
    dst->n_runs = 0;

    while ((rlepos < src_2->n_runs) && (arraypos < src_1->cardinality)) {
        if (src_2->runs[rlepos].value <= src_1->array[arraypos]) {
            run_container_smart_append_exclusive(dst, src_2->runs[rlepos].value,
                                                 src_2->runs[rlepos].length);
            rlepos++;
        } else {
            run_container_smart_append_exclusive(dst, src_1->array[arraypos],
                                                 0);
            arraypos++;
        }
    }
    while (arraypos < src_1->cardinality) {
        run_container_smart_append_exclusive(dst, src_1->array[arraypos], 0);
        arraypos++;
    }
    while (rlepos < src_2->n_runs) {
        run_container_smart_append_exclusive(dst, src_2->runs[rlepos].value,
                                             src_2->runs[rlepos].length);
        rlepos++;
    }
}